

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

AliasRet aa_fref(jit_State *J,IRIns *refa,IRIns *refb)

{
  AliasRet AVar1;
  
  AVar1 = ALIAS_NO;
  if ((refa->field_0).op2 == (refb->field_0).op2) {
    AVar1 = ALIAS_MUST;
    if (((refa->field_0).op1 != (refb->field_0).op1) &&
       (AVar1 = ALIAS_MAY, (ushort)((refa->field_0).op2 - 3) < 6)) {
      AVar1 = aa_table((jit_State *)&((J->cur).ir)->field_0,(uint)(refa->field_0).op1,
                       (uint)(refb->field_0).op1);
      return AVar1;
    }
  }
  return AVar1;
}

Assistant:

static AliasRet aa_fref(jit_State *J, IRIns *refa, IRIns *refb)
{
  if (refa->op2 != refb->op2)
    return ALIAS_NO;  /* Different fields. */
  if (refa->op1 == refb->op1)
    return ALIAS_MUST;  /* Same field, same object. */
  else if (refa->op2 >= IRFL_TAB_META && refa->op2 <= IRFL_TAB_NOMM)
    return aa_table(J, refa->op1, refb->op1);  /* Disambiguate tables. */
  else
    return ALIAS_MAY;  /* Same field, possibly different object. */
}